

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_factory.h
# Opt level: O0

shared_ptr<Shoes> __thiscall ProductRegistry::CreateLayer(ProductRegistry *this,ShoesParameter *p)

{
  size_type sVar1;
  ostream *poVar2;
  mapped_type *pp_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Shoes> sVar4;
  string local_70 [48];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
  *local_40;
  CreatorRegistry *registry;
  string type;
  ShoesParameter *p_local;
  
  std::__cxx11::string::string((string *)&registry,(string *)&p->type);
  local_40 = Registry_abi_cxx11_();
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
          ::count(local_40,(key_type *)&registry);
  if (sVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unknown shoes type: ");
    poVar2 = std::operator<<(poVar2,(string *)&registry);
    poVar2 = std::operator<<(poVar2," (known shoes types: ");
    TypeListString_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_70);
    exit(100);
  }
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
            ::operator[](local_40,(key_type *)&registry);
  (**pp_Var3)((ShoesParameter *)this);
  std::__cxx11::string::~string((string *)&registry);
  sVar4.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar4.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Shoes>)sVar4.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<Shoes> CreateLayer(const ShoesParameter& p) {
        string type = p.type;
        CreatorRegistry &registry = Registry();
        if (registry.count(type) == 0) {
            cout << "Unknown shoes type: " << type << " (known shoes types: " << TypeListString() << ")"<<endl;
            exit(100);
        }
        return registry[type](p);
    }